

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

void Gia_ManHashProfile(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = p->nHTable;
  uVar1 = Gia_ManAndNum(p);
  printf("Table size = %d. Entries = %d. ",(ulong)uVar5,(ulong)uVar1);
  printf("Hits = %d. Misses = %d.\n",(ulong)(uint)p->nHashHit,(ulong)(uint)p->nHashMiss);
  uVar5 = 1000;
  if (p->nHTable < 1000) {
    uVar5 = p->nHTable;
  }
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    if (p->pHTable[uVar4] == 0) {
      pGVar3 = (Gia_Obj_t *)0x0;
    }
    else {
      iVar2 = Abc_Lit2Var(p->pHTable[uVar4]);
      pGVar3 = Gia_ManObj(p,iVar2);
    }
    uVar1 = 0;
    while (pGVar3 != (Gia_Obj_t *)0x0) {
      if (pGVar3->Value == 0) {
        pGVar3 = (Gia_Obj_t *)0x0;
      }
      else {
        iVar2 = Abc_Lit2Var(pGVar3->Value);
        pGVar3 = Gia_ManObj(p,iVar2);
      }
      uVar1 = uVar1 + 1;
    }
    if (uVar1 != 0) {
      printf("%d ",(ulong)uVar1);
    }
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManHashProfile( Gia_Man_t * p )
{
    Gia_Obj_t * pEntry;
    int i, Counter, Limit;
    printf( "Table size = %d. Entries = %d. ", p->nHTable, Gia_ManAndNum(p) );
    printf( "Hits = %d. Misses = %d.\n", (int)p->nHashHit, (int)p->nHashMiss );
    Limit = Abc_MinInt( 1000, p->nHTable );
    for ( i = 0; i < Limit; i++ )
    {
        Counter = 0;
        for ( pEntry = (p->pHTable[i]? Gia_ManObj(p, Abc_Lit2Var(p->pHTable[i])) : NULL); 
              pEntry; 
              pEntry = (pEntry->Value? Gia_ManObj(p, Abc_Lit2Var(pEntry->Value)) : NULL) )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
    printf( "\n" );
}